

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O3

int to_pkcs8(char *in_path,char *out_path,char *file_pin)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int n;
  key_material_t pkey [18];
  char line [4096];
  char data [4096];
  uint local_2188;
  int local_2184;
  uint local_2180;
  int local_217c;
  long local_2178;
  FILE *local_2170;
  char *local_2168 [2];
  key_material_t local_2158 [18];
  char local_2038;
  char acStack_2037 [4095];
  uchar local_1038 [4104];
  
  memset(local_2158,0,0x120);
  if (in_path == (char *)0x0) {
    to_pkcs8();
    return 1;
  }
  if (out_path == (char *)0x0) {
    to_pkcs8();
    return 1;
  }
  __stream = fopen(in_path,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"ERROR: Could not open input file %.100s for reading.\n",in_path);
    return 1;
  }
  pcVar4 = fgets(&local_2038,0x1000,__stream);
  if (pcVar4 == (char *)0x0) {
    fclose(__stream);
    uVar7 = 0xffffffff;
  }
  else {
    local_2178 = 0xffffffff;
    local_2180 = 0;
    bVar1 = false;
    local_2188 = 0;
    local_2170 = __stream;
    local_2168[0] = file_pin;
    local_2168[1] = out_path;
    do {
      local_2188 = local_2188 + 1;
      local_2184 = 0;
      lVar8 = 0;
      uVar7 = 0xffffffff;
      do {
        uVar3 = uVar7;
        lVar9 = lVar8;
        if (lVar9 == 0x90) {
          to_pkcs8();
          goto LAB_001029d4;
        }
        pcVar4 = *(char **)((long)file_tags + lVar9);
        sVar5 = strlen(pcVar4);
        iVar2 = strncasecmp(&local_2038,pcVar4,sVar5);
        local_2184 = uVar3 + 2;
        uVar7 = uVar3 + 1;
        lVar8 = lVar9 + 8;
      } while (iVar2 != 0);
      pcVar4 = *(char **)((long)file_tags + lVar9);
      sVar5 = strlen(pcVar4);
      if (acStack_2037[sVar5] != '\0') {
        if ((local_2180 >> (uVar7 & 0x1f) & 1) == 0) {
          pcVar4 = acStack_2037 + sVar5;
          if (uVar3 - 1 < 0xd) {
            iVar2 = b64_pton(pcVar4,local_1038,0x1000);
            if (iVar2 == -1) {
              fprintf(_stderr,"ERROR: Could not parse the base64 string on line %i.\n",
                      (ulong)local_2188);
            }
            else {
              sVar5 = (size_t)iVar2;
              pvVar6 = malloc(sVar5);
              *(void **)((long)&local_2158[0].big + lVar9 * 2) = pvVar6;
              if (pvVar6 != (void *)0x0) {
                memcpy(pvVar6,local_1038,sVar5);
                *(size_t *)((long)local_2168 + (lVar9 + 8) * 2) = sVar5;
                goto LAB_00102a4f;
              }
              to_pkcs8();
            }
            goto LAB_00102b1a;
          }
          if (uVar7 == 1) {
            local_2178 = strtol(pcVar4,(char **)0x0,10);
          }
          else if (uVar7 == 0) {
            iVar2 = __isoc99_sscanf(pcVar4,"v%i.%i",&local_2184,&local_217c);
            if (iVar2 == 2) {
              if ((local_2184 < 2) && (local_217c < 4 || local_2184 != 1)) goto LAB_00102a4f;
              fprintf(_stderr,"ERROR: Cannot parse this version of file format, v%i.%i.\n");
            }
            else {
              fprintf(_stderr,"ERROR: Invalid/unknown version string (%.100s).\n",pcVar4);
            }
LAB_00102b1a:
            bVar1 = true;
          }
LAB_00102a4f:
          local_2180 = local_2180 | 1 << ((byte)uVar7 & 0x1f);
          __stream = local_2170;
        }
        else {
          fprintf(_stderr,"ERROR: Duplicate \"%s\" field, line %i - ignored\n",pcVar4,
                  (ulong)local_2188);
          __stream = local_2170;
        }
      }
LAB_001029d4:
      pcVar4 = fgets(&local_2038,0x1000,__stream);
    } while (pcVar4 != (char *)0x0);
    fclose(__stream);
    uVar7 = (uint)local_2178;
    out_path = local_2168[1];
    file_pin = local_2168[0];
    if (bVar1) {
      lVar8 = 8;
      do {
        pvVar6 = *(void **)((long)&local_2158[0].size + lVar8);
        if (pvVar6 != (void *)0x0) {
          free(pvVar6);
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x128);
      return 1;
    }
  }
  iVar2 = open(out_path,0x40,0x180);
  if (iVar2 == -1) {
    to_pkcs8();
    return 1;
  }
  close(iVar2);
  crypto_init();
  uVar3 = uVar7 + 1;
  if (uVar3 < 0xc) {
    if ((0xb44U >> (uVar3 & 0x1f) & 1) != 0) {
      iVar2 = save_rsa_pkcs8(out_path,file_pin,local_2158);
      goto LAB_00102c0b;
    }
    if ((0x90U >> (uVar3 & 0x1f) & 1) != 0) {
      iVar2 = save_dsa_pkcs8(out_path,file_pin,local_2158);
      goto LAB_00102c0b;
    }
    if (uVar3 != 0) goto LAB_00102c97;
    to_pkcs8();
  }
  else {
LAB_00102c97:
    fprintf(_stderr,"ERROR: The algorithm %i is not supported.\n",(ulong)uVar7);
  }
  iVar2 = 1;
LAB_00102c0b:
  crypto_final();
  lVar8 = 8;
  do {
    pvVar6 = *(void **)((long)&local_2158[0].size + lVar8);
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x128);
  return iVar2;
}

Assistant:

int to_pkcs8(char* in_path, char* out_path, char* file_pin)
{
	FILE* file_pointer = NULL;
	char line[MAX_LINE], data[MAX_LINE];
	char* value_pointer = NULL;
	int lineno = 0, m, n, error = 0, found, algorithm = DNS_KEYALG_ERROR, data_length;
	uint32_t bitfield = 0;
	key_material_t pkey[TAG_MAX];

	if (in_path == NULL)
	{
		fprintf(stderr, "ERROR: A path to the input file must be supplied. Use --in <path>\n");
		return 1;
	}

	if (out_path == NULL)
	{
		fprintf(stderr, "ERROR: A path to the output file must be supplied. Use --out <path>\n");
		return 1;
	}

	file_pointer = fopen(in_path, "r");
	if (file_pointer == NULL)
	{
		fprintf(stderr, "ERROR: Could not open input file %.100s for reading.\n", in_path);
		return 1;
	}

	// Loop over all of the lines
	while (fgets(line, MAX_LINE, file_pointer) != NULL)
	{
		lineno++;

		// Find the current text field in the BIND file.
		for (m = 0, found = -1; found == -1 && file_tags[m]; m++)
		{
			if (strncasecmp(line, file_tags[m], strlen(file_tags[m])) == 0)
			{
				found = m;
			}
		}

		// The text files is not recognized.
		if (found == -1)
		{
			fprintf(stderr, "ERROR: Unrecognized input line %i\n", lineno);
			fprintf(stderr, "ERROR: --> %s", line);
			continue;
		}

		// Point to the data for this text field.
		value_pointer = line + strlen(file_tags[found]) + 1;

		// Continue if we are at the end of the string
		if (*value_pointer == 0)
		{
			continue;
		}

		// Check that we do not get duplicates.
		if (bitfield & (1 << found))
		{
			fprintf(stderr, "ERROR: Duplicate \"%s\" field, line %i - ignored\n",
					file_tags[found], lineno);
			continue;
		}
		bitfield |= (1 << found);

		// Handle the data for this text field.
		switch (found)
		{
			case TAG_VERSION:
				if (sscanf(value_pointer, "v%i.%i", &m, &n) != 2)
				{
					fprintf(stderr, "ERROR: Invalid/unknown version string "
							"(%.100s).\n", value_pointer);
					error = 1;
					break;
				}
				if (m > FILE_MAJOR_VERSION || (m == FILE_MAJOR_VERSION && n > FILE_MINOR_VERSION))
				{
					fprintf(stderr, "ERROR: Cannot parse this version of file format, "
							"v%i.%i.\n", m, n);
					error = 1;
				}
				break;
			case TAG_ALGORITHM:
				algorithm = strtol(value_pointer, NULL, 10);
				break;
			// RSA
			case TAG_MODULUS:
			case TAG_PUBEXP:
			case TAG_PRIVEXP:
			case TAG_PRIME1:
			case TAG_PRIME2:
			case TAG_EXP1:
			case TAG_EXP2:
			case TAG_COEFF:
			// DSA
			case TAG_PRIME:
			case TAG_SUBPRIME:
			case TAG_BASE:
			case TAG_PRIVVAL:
			case TAG_PUBVAL:
				data_length = b64_pton(value_pointer, (unsigned char*)data, MAX_LINE);
				if (data_length == -1)
				{
					error = 1;
					fprintf(stderr, "ERROR: Could not parse the base64 string on line %i.\n", lineno);
				}
				else
				{
					pkey[found].big = malloc(data_length);
					if (!pkey[found].big)
					{
						fprintf(stderr, "ERROR: Could not allocate memory.\n");
						error = 1;
						break;
					}
					memcpy(pkey[found].big, data, data_length);
					pkey[found].size = data_length;
				}
				break;
			// Do not need these
			case TAG_CREATED:
			case TAG_PUBLISH:
			case TAG_ACTIVATE:
			default:
				break;
		}
	}

	fclose(file_pointer);

	// Something went wrong. Clean up and quit.
	if (error)
	{
		free_key_material(pkey);
		return error;
	}

	// Create and set file permissions if the file does not exist.
	int fd = open(out_path, O_CREAT, S_IRUSR | S_IWUSR);
	if (fd == -1)
	{
		fprintf(stderr, "ERROR: Could not open the output file: %s (errno %i)\n",
			out_path, errno);
		free_key_material(pkey);
		return 1;
	}
	::close(fd);

	crypto_init();

	// Save the the key to the disk
	switch (algorithm)
	{
		case DNS_KEYALG_ERROR:
			fprintf(stderr, "ERROR: The algorithm %i was not given in the file.\n",
					algorithm);
			error = 1;
			break;
		case DNS_KEYALG_RSAMD5:
		case DNS_KEYALG_RSASHA1:
		case DNS_KEYALG_RSASHA1_NSEC3_SHA1:
		case DNS_KEYALG_RSASHA256:
		case DNS_KEYALG_RSASHA512:
			error = save_rsa_pkcs8(out_path, file_pin, pkey);
			break;
		case DNS_KEYALG_DSA:
		case DNS_KEYALG_DSA_NSEC3_SHA1:
			error = save_dsa_pkcs8(out_path, file_pin, pkey);
			break;
		case DNS_KEYALG_ECC:
		case DNS_KEYALG_ECC_GOST:
		default:
			fprintf(stderr, "ERROR: The algorithm %i is not supported.\n",
					algorithm);
			error = 1;
			break;
	}

	crypto_final();
	free_key_material(pkey);

	return error;
}